

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::UpdateWitnessStackRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::UpdateWitnessStackRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  undefined8 uVar3;
  RawTransactionResponse res;
  RawTransactionResponseStruct response;
  UpdateWitnessStackRequestStruct request;
  UpdateWitnessStackRequest req;
  undefined1 local_4a8 [16];
  _func_int *local_498 [2];
  int local_488;
  _Alloc_hider local_480;
  undefined1 local_470 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  undefined1 local_450 [16];
  undefined1 local_440 [48];
  undefined1 auStack_410 [32];
  _Base_ptr p_Stack_3f0;
  size_t local_3e8;
  undefined1 local_3e0 [40];
  _Alloc_hider local_3b8;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  size_type local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  string local_318;
  UpdateWitnessStackRequestStruct local_2f8;
  UpdateWitnessStackRequest local_1a0;
  
  UpdateWitnessStackRequest::UpdateWitnessStackRequest(&local_1a0);
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>::Deserialize
            (&local_1a0.super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>,
             (string *)this);
  UpdateWitnessStackRequest::ConvertToStruct(&local_2f8,&local_1a0);
  local_3e0._0_8_ = local_3e0 + 0x10;
  local_3e0._8_8_ = 0;
  local_3e0[0x10] = '\0';
  local_3e0._32_4_ = 0;
  local_3b8._M_p = (pointer)&local_3a8;
  local_3b0 = 0;
  local_3a8._M_local_buf[0] = '\0';
  local_398._M_p = (pointer)&local_388;
  local_390 = 0;
  local_388._M_local_buf[0] = '\0';
  p_Var1 = &local_378._M_impl.super__Rb_tree_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_348._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348._M_impl.super__Rb_tree_header._M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_378._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_2f8.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f47aa:
      uVar3 = std::__throw_bad_function_call();
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_4a8);
      psVar2 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
      if (psVar2 != (string *)&local_3b8) {
        operator_delete(psVar2);
      }
      RawTransactionResponseStruct::~RawTransactionResponseStruct
                ((RawTransactionResponseStruct *)local_3e0);
      UpdateWitnessStackRequestStruct::~UpdateWitnessStackRequestStruct(&local_2f8);
      UpdateWitnessStackRequest::~UpdateWitnessStackRequest(&local_1a0);
      _Unwind_Resume(uVar3);
    }
    (*bitcoin_function->_M_invoker)
              ((RawTransactionResponseStruct *)local_4a8,(_Any_data *)bitcoin_function,&local_2f8);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f47aa;
    (**(code **)((long)&request_message->field_2 + 8))(local_4a8,request_message,&local_2f8);
  }
  std::__cxx11::string::operator=((string *)local_3e0,(string *)local_4a8);
  local_3e0._32_4_ = local_488;
  std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_480);
  std::__cxx11::string::operator=((string *)&local_398,(string *)(local_470 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_378);
  if ((_Base_ptr)local_440._16_8_ != (_Base_ptr)0x0) {
    local_378._M_impl.super__Rb_tree_header._M_header._M_color = local_440._8_4_;
    local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_440._16_8_;
    local_378._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_440._24_8_;
    local_378._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_440._32_8_;
    *(_Rb_tree_header **)(local_440._16_8_ + 8) = p_Var1;
    local_378._M_impl.super__Rb_tree_header._M_node_count = local_440._40_8_;
    local_440._16_8_ = (_Base_ptr)0x0;
    local_440._40_8_ = 0;
    local_440._24_8_ = (_Base_ptr)(local_440 + 8);
    local_440._32_8_ = (_Base_ptr)(local_440 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_348);
  if ((_Base_ptr)auStack_410._16_8_ != (_Base_ptr)0x0) {
    local_348._M_impl.super__Rb_tree_header._M_header._M_color = auStack_410._8_4_;
    local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_410._16_8_;
    local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_410._24_8_;
    local_348._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_3f0;
    *(_Rb_tree_header **)(auStack_410._16_8_ + 8) = &local_348._M_impl.super__Rb_tree_header;
    local_348._M_impl.super__Rb_tree_header._M_node_count = local_3e8;
    auStack_410._16_8_ = (_Base_ptr)0x0;
    local_3e8 = 0;
    auStack_410._24_8_ = (_Base_ptr)(auStack_410 + 8);
    p_Stack_3f0 = (_Base_ptr)(auStack_410 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_410);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_450 + 0x10));
  if ((undefined1 *)local_460._M_allocated_capacity != local_450) {
    operator_delete((void *)local_460._M_allocated_capacity);
  }
  if ((_Base_ptr)local_480._M_p != (_Base_ptr)local_470) {
    operator_delete(local_480._M_p);
  }
  if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
    operator_delete((void *)local_4a8._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_3e0._32_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_4a8);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_4a8,(RawTransactionResponseStruct *)local_3e0);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
              (&local_318,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)local_4a8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_4a8);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_4a8,(InnerErrorResponseStruct *)(local_3e0 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_318,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_4a8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    local_4a8._0_8_ = &PTR__ErrorResponseBase_00a85a68;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_470);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_4a8 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_348);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_p != &local_388) {
    operator_delete(local_398._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_p != &local_3a8) {
    operator_delete(local_3b8._M_p);
  }
  if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
    operator_delete((void *)local_3e0._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8.txin.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8.txin.witness_stack.ignore_items._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.witness_stack.sighash_type._M_dataplus._M_p !=
      &local_2f8.txin.witness_stack.sighash_type.field_2) {
    operator_delete(local_2f8.txin.witness_stack.sighash_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.witness_stack.type._M_dataplus._M_p !=
      &local_2f8.txin.witness_stack.type.field_2) {
    operator_delete(local_2f8.txin.witness_stack.type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.witness_stack.hex._M_dataplus._M_p !=
      &local_2f8.txin.witness_stack.hex.field_2) {
    operator_delete(local_2f8.txin.witness_stack.hex._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.txid._M_dataplus._M_p != &local_2f8.txin.txid.field_2) {
    operator_delete(local_2f8.txin.txid._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.tx._M_dataplus._M_p != &local_2f8.tx.field_2) {
    operator_delete(local_2f8.tx._M_dataplus._M_p);
  }
  UpdateWitnessStackRequest::~UpdateWitnessStackRequest(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}